

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O0

sexp_conflict
sexp_forkpty_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg2,
                 sexp_conflict arg3)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  int iVar7;
  uint *in_RCX;
  long in_RSI;
  long in_RDI;
  uint *in_R8;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_conflict res1;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict res0;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  char tmp1 [256];
  int tmp0;
  undefined8 local_1d0;
  undefined8 local_1c0;
  double *local_180;
  undefined8 local_178;
  double local_170;
  double *local_168;
  undefined8 local_160;
  double local_158;
  sexp_conflict *local_150;
  undefined8 local_148;
  sexp_conflict local_140;
  undefined1 local_138 [260];
  int local_34;
  uint *local_30;
  uint *local_28;
  long local_18;
  long local_10;
  sexp_conflict local_8;
  
  local_140 = (sexp_conflict)0x43e;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_150,0,0x10);
  local_158 = 5.36555291383594e-321;
  memset(&local_168,0,0x10);
  local_170 = 5.36555291383594e-321;
  memset(&local_180,0,0x10);
  lVar6 = local_10;
  if (((((ulong)local_28 & 3) == 0) &&
      (auVar2._8_8_ = (long)*(ulong *)(local_18 + 0x40) >> 0x3f,
      auVar2._0_8_ = *(ulong *)(local_18 + 0x40) & 0xfffffffffffffffe,
      (ulong)*local_28 == SUB168(auVar2 / SEXT816(2),0))) || (local_28 == (uint *)0x3e)) {
    if (((((ulong)local_30 & 3) == 0) &&
        (uVar1 = *(ulong *)(*(long *)(local_18 + 0x48) + 0x10), auVar4._8_8_ = (long)uVar1 >> 0x3f,
        auVar4._0_8_ = uVar1 & 0xfffffffffffffffe, (ulong)*local_30 == SUB168(auVar4 / SEXT816(2),0)
        )) || (local_30 == (uint *)0x3e)) {
      local_150 = &local_140;
      local_148 = *(undefined8 *)(local_10 + 0x6080);
      *(sexp_conflict ***)(local_10 + 0x6080) = &local_150;
      local_168 = &local_158;
      local_160 = *(undefined8 *)(local_10 + 0x6080);
      *(double ***)(local_10 + 0x6080) = &local_168;
      local_180 = &local_170;
      local_178 = *(undefined8 *)(local_10 + 0x6080);
      *(double ***)(local_10 + 0x6080) = &local_180;
      if (local_28 == (uint *)0x3e) {
        local_1c0 = 0;
      }
      else {
        local_1c0 = *(undefined8 *)(local_28 + 6);
      }
      if (local_30 == (uint *)0x3e) {
        local_1d0 = 0;
      }
      else {
        local_1d0 = *(undefined8 *)(local_30 + 6);
      }
      iVar7 = forkpty(&local_34,local_138,local_1c0,local_1d0);
      local_140 = (sexp_conflict)sexp_make_integer(lVar6,(long)iVar7,(long)iVar7 >> 0x3f);
      local_158 = (double)sexp_make_fileno_op(local_10,0,2,(long)local_34 << 1 | 1,0x3e);
      local_170 = (double)sexp_c_string(local_10,local_138,0xffffffffffffffff);
      local_140 = (sexp_conflict)sexp_cons_op(local_10,0,2,local_140,0x23e);
      sexp_push_op(local_10,&local_140,(local_140->value).flonum);
      (((local_140->value).type.cpl)->value).flonum = local_170;
      sexp_push_op(local_10,&local_140,(local_140->value).flonum);
      (((local_140->value).type.cpl)->value).flonum = local_158;
      *(undefined8 *)(local_10 + 0x6080) = local_148;
      local_8 = local_140;
    }
    else {
      uVar1 = *(ulong *)(*(long *)(local_18 + 0x48) + 0x10);
      auVar5._8_8_ = (long)uVar1 >> 0x3f;
      auVar5._0_8_ = uVar1 & 0xfffffffffffffffe;
      local_8 = (sexp_conflict)
                sexp_type_exception(local_10,local_18,SUB168(auVar5 / SEXT816(2),0),local_30);
    }
  }
  else {
    auVar3._8_8_ = (long)*(ulong *)(local_18 + 0x40) >> 0x3f;
    auVar3._0_8_ = *(ulong *)(local_18 + 0x40) & 0xfffffffffffffffe;
    local_8 = (sexp_conflict)
              sexp_type_exception(local_10,local_18,SUB168(auVar3 / SEXT816(2),0),local_28);
  }
  return local_8;
}

Assistant:

sexp sexp_forkpty_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg2, sexp arg3) {
  int tmp0;
  char tmp1[256];
  sexp_gc_var3(res, res0, res1);
  if (! ((sexp_pointerp(arg2) && (sexp_pointer_tag(arg2) == sexp_unbox_fixnum(sexp_opcode_arg3_type(self)))) || sexp_not(arg2)))
    return sexp_type_exception(ctx, self, sexp_unbox_fixnum(sexp_opcode_arg3_type(self)), arg2);
  if (! ((sexp_pointerp(arg3) && (sexp_pointer_tag(arg3) == sexp_unbox_fixnum(sexp_vector_ref(sexp_opcode_argn_type(self), SEXP_ZERO)))) || sexp_not(arg3)))
    return sexp_type_exception(ctx, self, sexp_unbox_fixnum(sexp_vector_ref(sexp_opcode_argn_type(self), SEXP_ZERO)), arg3);
  sexp_gc_preserve3(ctx, res, res0, res1);
  res = sexp_make_integer(ctx, forkpty(&tmp0, tmp1, (struct termios*)sexp_cpointer_maybe_null_value(arg2), (struct winsize*)sexp_cpointer_maybe_null_value(arg3)));
  res0 = sexp_make_fileno(ctx, sexp_make_fixnum(tmp0), SEXP_FALSE);
  res1 = sexp_c_string(ctx, tmp1, -1);
  res = sexp_cons(ctx, res, SEXP_NULL);
  sexp_push(ctx, res, sexp_car(res));
  sexp_cadr(res) = res1;
  sexp_push(ctx, res, sexp_car(res));
  sexp_cadr(res) = res0;
  sexp_gc_release3(ctx);
  return res;
}